

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::OffsetIndex::printTo(OffsetIndex *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  vector<duckdb_parquet::PageLocation,_true> *in_stack_00000148;
  string local_60 [48];
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"OffsetIndex(");
  poVar1 = std::operator<<(local_10,"page_locations=");
  duckdb_apache::thrift::to_string<duckdb_parquet::PageLocation>(in_stack_00000148);
  std::operator<<(poVar1,local_30);
  std::__cxx11::string::~string(local_30);
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"unencoded_byte_array_data_bytes=");
  poVar1 = local_10;
  if ((*(byte *)(in_RDI + 0x38) & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<long>((vector<long,_true> *)in_stack_00000148);
    std::operator<<(poVar1,local_60);
    std::__cxx11::string::~string(local_60);
  }
  std::operator<<(local_10,")");
  return;
}

Assistant:

void OffsetIndex::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "OffsetIndex(";
  out << "page_locations=" << to_string(page_locations);
  out << ", " << "unencoded_byte_array_data_bytes="; (__isset.unencoded_byte_array_data_bytes ? (out << to_string(unencoded_byte_array_data_bytes)) : (out << "<null>"));
  out << ")";
}